

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

bool __thiscall Kernel::AppliedTerm::equalsShallow(AppliedTerm *this,AppliedTerm other)

{
  bool bVar1;
  TermList *in_RDI;
  byte in_stack_00000010;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  if (((in_RDI[1]._content & 1) != 0) || ((in_stack_00000010 & 1) != 0)) {
    bVar1 = TermList::ground((TermList *)
                             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    if (!bVar1) {
      return false;
    }
    bVar1 = TermList::ground((TermList *)(ulong)in_stack_ffffffffffffffe0);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = TermList::operator==(in_RDI,(TermList *)&stack0x00000008);
  return bVar1;
}

Assistant:

bool equalsShallow(AppliedTerm other) const {
    return ((!aboveVar && !other.aboveVar) || (term.ground() && other.term.ground()))
      && term==other.term;
  }